

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::callbackProcessing(FederateState *this)

{
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_00;
  FederateStates FVar1;
  bool bVar2;
  MessageProcessingResult MVar3;
  bool bVar4;
  mapped_type *pmVar5;
  FederateStates lastState;
  ActionMessage gError;
  optional<helics::ActionMessage> cmd;
  undefined1 local_1b0 [184];
  bool local_f8;
  undefined1 local_f0 [184];
  bool local_38;
  
  if (((this->state)._M_i != FINISHED) &&
     (FVar1 = (this->state)._M_i, ((this->initRequested)._M_base._M_i & 1U) != 0)) {
    while( true ) {
      lastState = (this->state)._M_i;
      MVar3 = processDelayQueue(this);
      if (MVar3 < NEXT_STEP) break;
      callbackReturnResult(this,lastState,MVar3,(this->state)._M_i);
    }
    this_00 = &this->queue;
    gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
    try_pop((optional<helics::ActionMessage> *)local_f0,this_00);
    if (local_38 == true) {
      bVar2 = false;
      do {
        bVar4 = messageShouldBeDelayed(this,(ActionMessage *)local_f0);
        if (bVar4) {
          pmVar5 = std::
                   map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                   ::operator[](&this->delayQueues,(key_type *)(local_f0 + 8));
          CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                    ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)pmVar5,
                     (value_type *)local_f0);
          gmlc::containers::
          BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
                    ((optional<helics::ActionMessage> *)local_1b0,this_00);
        }
        else {
          MVar3 = processActionMessage(this,(ActionMessage *)local_f0);
          if (MVar3 == ERROR_RESULT) {
            bVar4 = (bool)(bVar2 | local_f0._0_4_ == cmd_global_error);
            if ((((FVar1 != ERRORED) && ((this->state)._M_i == ERRORED)) &&
                (!bVar2 && local_f0._0_4_ != cmd_global_error)) &&
               (this->mParent != (CommonCore *)0x0)) {
              ActionMessage::ActionMessage((ActionMessage *)local_1b0,cmd_local_error);
              if (this->terminate_on_error == true) {
                ActionMessage::setAction((ActionMessage *)local_1b0,cmd_global_error);
              }
              else {
                TimeCoordinator::localError
                          ((this->timeCoord)._M_t.
                           super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                           .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
              }
              local_1b0._8_4_ = (this->global_id)._M_i.gid;
              local_1b0._16_4_ = 0;
              local_1b0._4_4_ = this->errorCode;
              SmallBuffer::operator=((SmallBuffer *)(local_1b0 + 0x40),&this->errorString);
              BrokerBase::addActionMessage
                        (&this->mParent->super_BrokerBase,(ActionMessage *)local_1b0);
              ActionMessage::~ActionMessage((ActionMessage *)local_1b0);
              bVar4 = false;
            }
          }
          else {
            bVar4 = bVar2;
            if (MVar3 == DELAY_MESSAGE) {
              local_1b0._0_4_ = local_f0._8_4_;
              pmVar5 = std::
                       map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                       ::operator[](&this->delayQueues,(key_type *)local_1b0);
              CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
              push_back((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                        pmVar5,(value_type *)local_f0);
            }
          }
          if (FVar1 == ERRORED) {
            MVar3 = ERROR_RESULT;
          }
          if (DELAY_MESSAGE < MVar3) {
            callbackReturnResult(this,lastState,MVar3,(this->state)._M_i);
            lastState = (this->state)._M_i;
          }
          gmlc::containers::
          BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
                    ((optional<helics::ActionMessage> *)local_1b0,this_00);
          bVar2 = bVar4;
        }
        std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                  ((_Optional_payload_base<helics::ActionMessage> *)local_f0,
                   (_Optional_payload_base<helics::ActionMessage> *)local_1b0);
        if (local_f8 == true) {
          local_f8 = false;
          ActionMessage::~ActionMessage((ActionMessage *)local_1b0);
        }
      } while (local_38 != false);
    }
  }
  return;
}

Assistant:

uint64_t FederateState::getQueueSize() const
{
    uint64_t cnt = 0;
    for (const auto& end_point : interfaceInformation.getEndpoints()) {
        cnt += end_point->availableMessages();
    }
    return cnt;
}